

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

reentrant_consume_operation * __thiscall
density::
conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
try_start_reentrant_consume
          (reentrant_consume_operation *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *this)

{
  lock_guard<std::mutex> lock;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  lock._M_device = &this->m_mutex;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe0,&this->m_mutex);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  try_start_reentrant_consume
            ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
              *)&stack0xffffffffffffffd0);
  reentrant_consume_operation::reentrant_consume_operation
            (__return_storage_ptr__,0,this,(reentrant_consume_operation *)&stack0xffffffffffffffd0);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&stack0xffffffffffffffd0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

reentrant_consume_operation try_start_reentrant_consume() noexcept
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            return reentrant_consume_operation(
              PrivateType(), this, m_queue.try_start_reentrant_consume());
        }